

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

ON_NurbsCurve * ToCurve(ON_NurbsSurface *srf,int dir,ON_NurbsCurve *crv)

{
  void *__dest;
  double *__src;
  bool bVar1;
  int iVar2;
  double *local_68;
  size_t sz;
  int j;
  int i;
  double *psrc;
  double *pdst;
  void *pvStack_30;
  int srf_cv_size;
  double *tmp_cv;
  ON_NurbsCurve *crv_local;
  int dir_local;
  ON_NurbsSurface *srf_local;
  
  pvStack_30 = (void *)0x0;
  if ((dir < 0) || (1 < dir)) {
    srf_local = (ON_NurbsSurface *)0x0;
  }
  else if (srf->m_cv == (double *)0x0) {
    srf_local = (ON_NurbsSurface *)0x0;
  }
  else {
    tmp_cv = (double *)crv;
    if (crv == (ON_NurbsCurve *)0x0) {
      tmp_cv = (double *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)tmp_cv);
    }
    iVar2 = ON_NurbsSurface::CVSize(srf);
    bVar1 = ON_NurbsCurve::Create
                      ((ON_NurbsCurve *)tmp_cv,iVar2 * srf->m_cv_count[1 - dir],false,
                       srf->m_order[dir],srf->m_cv_count[dir]);
    if (bVar1) {
      if ((double *)tmp_cv[7] == srf->m_cv) {
        pvStack_30 = onmalloc((long)(*(int *)(tmp_cv + 2) * *(int *)(tmp_cv + 6)) << 3);
        tmp_cv[7] = (double)pvStack_30;
      }
      for (sz._4_4_ = 0; sz._4_4_ < srf->m_cv_count[dir]; sz._4_4_ = sz._4_4_ + 1) {
        psrc = ON_NurbsCurve::CV((ON_NurbsCurve *)tmp_cv,sz._4_4_);
        if (dir == 0) {
          local_68 = ON_NurbsSurface::CV(srf,sz._4_4_,0);
        }
        else {
          local_68 = ON_NurbsSurface::CV(srf,0,sz._4_4_);
        }
        _j = local_68;
        for (sz._0_4_ = 0; (int)sz < srf->m_cv_count[1 - dir]; sz._0_4_ = (int)sz + 1) {
          memcpy(psrc,_j,(long)iVar2 << 3);
          _j = _j + srf->m_cv_stride[1 - dir];
          psrc = psrc + iVar2;
        }
      }
      if (pvStack_30 != (void *)0x0) {
        tmp_cv[7] = (double)srf->m_cv;
        memcpy((void *)tmp_cv[7],pvStack_30,(long)(*(int *)(tmp_cv + 2) * *(int *)(tmp_cv + 6)) << 3
              );
        onfree(pvStack_30);
      }
      if ((double *)tmp_cv[5] != srf->m_knot[dir]) {
        __dest = (void *)tmp_cv[5];
        __src = srf->m_knot[dir];
        iVar2 = ON_NurbsCurve::KnotCount((ON_NurbsCurve *)tmp_cv);
        memcpy(__dest,__src,(long)iVar2 << 3);
      }
      srf_local = (ON_NurbsSurface *)tmp_cv;
    }
    else {
      srf_local = (ON_NurbsSurface *)0x0;
    }
  }
  return (ON_NurbsCurve *)srf_local;
}

Assistant:

static ON_NurbsCurve* ToCurve( const ON_NurbsSurface& srf, int dir, 
                               ON_NurbsCurve* crv )
{
  double* tmp_cv = nullptr;
  if ( dir < 0 || dir > 1 )
    return nullptr;
  if ( !srf.m_cv )
    return nullptr;
  if ( !crv )
    crv = new ON_NurbsCurve();
  int srf_cv_size = srf.CVSize();
  if ( !crv->Create(
          srf_cv_size*srf.m_cv_count[1-dir], // dim
          false, // is_rat
          srf.m_order[dir],
          srf.m_cv_count[dir]
          ) )
    return nullptr;
  if ( crv->m_cv == srf.m_cv )
  {
    tmp_cv = (double*)onmalloc( crv->m_dim*crv->m_cv_stride*sizeof(tmp_cv[0]) );
    crv->m_cv = tmp_cv;
  }
  double* pdst;
  const double* psrc;
  int i, j;
  size_t sz = srf_cv_size*sizeof(pdst[0]);
  for ( i = 0; i < srf.m_cv_count[dir]; i++ )
  {
    pdst = crv->CV(i);
    psrc = dir ? srf.CV(0,i) : srf.CV(i,0);
    for ( j = 0; j < srf.m_cv_count[1-dir]; j++ )
    {
      memcpy( pdst, psrc, sz );
      psrc += srf.m_cv_stride[1-dir];
      pdst += srf_cv_size;
    }
  }
  if ( tmp_cv )
  {
    crv->m_cv = srf.m_cv;
    memcpy( crv->m_cv, tmp_cv, crv->m_dim*crv->m_cv_stride*sizeof(tmp_cv[0]) );
    onfree(tmp_cv);
  }
  if ( crv->m_knot != srf.m_knot[dir] )
    memcpy( crv->m_knot, srf.m_knot[dir], crv->KnotCount()*sizeof(crv->m_knot[0]) );
  return crv;
}